

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

void __thiscall
pybind11::arg_v::arg_v<char_const(&)[5]>(arg_v *this,arg *base,char (*x) [5],char *descr)

{
  undefined8 uVar1;
  handle hVar2;
  
  uVar1 = *(undefined8 *)&base->field_0x8;
  (this->super_arg).name = base->name;
  *(undefined8 *)&(this->super_arg).field_0x8 = uVar1;
  hVar2 = detail::type_caster<char,_void>::cast(*x,automatic,(handle)0x0);
  (this->value).super_handle.m_ptr = hVar2.m_ptr;
  this->descr = descr;
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  *(undefined4 *)&(this->type).field_2 = 0x635f3541;
  (this->type)._M_string_length = 4;
  (this->type).field_2._M_local_buf[4] = '\0';
  detail::clean_type_id(&this->type);
  return;
}

Assistant:

arg_v(arg &&base, T &&x, const char *descr = nullptr)
        : arg(base),
          value(reinterpret_steal<object>(
              detail::make_caster<T>::cast(x, return_value_policy::automatic, {})
          )),
          descr(descr)
#if !defined(NDEBUG)
        , type(type_id<T>())
#endif
    { }